

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O2

void __thiscall
clipp::usage_lines::write<std::ostream>
          (usage_lines *this,basic_ostream<char,_std::char_traits<char>_> *os)

{
  int iVar1;
  formatting_ostream<std::basic_ostream<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  string local_1f0;
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  local_1d0;
  context local_1b8;
  context cur;
  
  local_220.curCol_ = 0;
  local_220.firstCol_ = (this->fmt_).firstCol_;
  if (local_220.firstCol_ < 1) {
    local_220.firstCol_ = 0;
  }
  iVar1 = (this->fmt_).lastCol_;
  local_220.lastCol_ = 0;
  if (0 < iVar1) {
    local_220.lastCol_ = iVar1;
  }
  local_220.hangingIndent_ = (int)(this->prefix_)._M_string_length;
  if ((int)((double)(local_220.lastCol_ - local_220.firstCol_) * 0.4) <=
      local_220.firstCol_ + local_220.hangingIndent_) {
    local_220.hangingIndent_ = (this->fmt_).indentSize_;
  }
  local_220.paragraphSpacing_ = (this->fmt_).paragraphSpc_;
  local_220.paragraphSpacingThreshold_ = 2;
  local_220.curBlankLines_ = 0;
  local_220.curParagraphLines_ = 1;
  local_220.totalNonBlankLines_ = 0;
  local_220.ignoreInputNls_ = (this->fmt_).ignoreNewlines_;
  local_220.os_ = os;
  context::context(&cur);
  group::begin_dfs((depth_first_traverser *)&local_1d0,this->cli_);
  std::
  vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::_M_move_assign((vector<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                    *)&cur,&local_1d0);
  std::
  _Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
  ::~_Vector_base(&local_1d0);
  cur.linestart = true;
  cur.level = (int)(((long)cur.pos.stack_.
                           super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)cur.pos.stack_.
                          super__Vector_base<clipp::group::depth_first_traverser::context,_std::allocator<clipp::group::depth_first_traverser::context>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x18);
  cur.outermost = this->cli_;
  context::context(&local_1b8,&cur);
  std::__cxx11::string::string((string *)&local_1f0,(string *)&this->prefix_);
  write<clipp::detail::formatting_ostream<std::ostream,std::__cxx11::string>>
            (this,&local_220,&local_1b8,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  context::~context(&local_1b8);
  context::~context(&cur);
  return;
}

Assistant:

formatting_ostream(OStream& os):
        os_(os),
        curCol_{0}, firstCol_{0}, lastCol_{100},
        hangingIndent_{0}, paragraphSpacing_{0}, paragraphSpacingThreshold_{2},
        curBlankLines_{0}, curParagraphLines_{1},
        totalNonBlankLines_{0},
        ignoreInputNls_{false}
    {}